

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  undefined7 uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  char cVar6;
  ulong _pos;
  size_t sVar7;
  string remainder;
  string wrappableChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar4 = _attr->indent;
  sVar7 = _attr->width;
  cVar6 = _attr->tabChar;
  uVar1 = *(undefined7 *)&_attr->field_0x19;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar4;
  (this->attr).width = sVar7;
  (this->attr).tabChar = cVar6;
  *(undefined7 *)&(this->attr).field_0x19 = uVar1;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&wrappableChars," [({.,/|\\-",(allocator *)&remainder);
  sVar4 = _attr->initialIndent;
  sVar7 = _attr->indent;
  std::__cxx11::string::string((string *)&remainder,(string *)_str);
  if (sVar4 != 0xffffffffffffffff) {
    sVar7 = sVar4;
  }
  while (remainder._M_string_length != 0) {
    _pos = _attr->width - sVar7;
    if (remainder._M_string_length <= _pos) {
      _pos = remainder._M_string_length;
    }
    cVar6 = (char)&remainder;
    uVar2 = std::__cxx11::string::find(cVar6,10);
    if (uVar2 < _pos) {
      _pos = uVar2;
    }
    lVar3 = std::__cxx11::string::rfind(cVar6,(ulong)(uint)(int)_attr->tabChar);
    if (lVar3 != -1) {
      cVar6 = remainder._M_dataplus._M_p[_pos];
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&remainder);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&remainder);
      std::operator+(&local_50,&local_70,&local_90);
      _pos = _pos - (cVar6 == '\n');
      std::__cxx11::string::operator=((string *)&remainder,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (_pos == remainder._M_string_length) {
      spliceLine(this,sVar7,&remainder,_pos);
    }
    else if (remainder._M_dataplus._M_p[_pos] == '\n') {
      spliceLine(this,sVar7,&remainder,_pos);
      if ((_pos < 2) || (remainder._M_string_length != 1)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&remainder);
        std::__cxx11::string::operator=((string *)&remainder,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      sVar7 = _attr->indent;
    }
    else {
      sVar4 = std::__cxx11::string::find_last_of((string *)&remainder,(ulong)&wrappableChars);
      if (sVar4 - 1 < 0xfffffffffffffffe) {
        spliceLine(this,sVar7,&remainder,sVar4);
        if (*remainder._M_dataplus._M_p == ' ') {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&remainder);
          std::__cxx11::string::operator=((string *)&remainder,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        spliceLine(this,sVar7,&remainder,_pos - 1);
        std::__cxx11::string::append
                  ((char *)((this->lines).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1));
      }
      if ((long)(this->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        sVar7 = _attr->indent;
      }
      lVar5 = 0;
      if (lVar3 != -1) {
        lVar5 = lVar3;
      }
      sVar7 = sVar7 + lVar5;
    }
  }
  std::__cxx11::string::~string((string *)&remainder);
  std::__cxx11::string::~string((string *)&wrappableChars);
  return;
}

Assistant:

SourceLineInfo() : line( 0 ){}